

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MidiFile.cpp
# Opt level: O1

string * __thiscall
smf::MidiFile::getBase64_abi_cxx11_(string *__return_storage_ptr__,MidiFile *this,int width)

{
  stringstream output;
  stringstream local_1a0 [16];
  ostream local_190 [112];
  ios_base local_120 [264];
  
  std::__cxx11::stringstream::stringstream(local_1a0);
  writeBase64(this,local_190,width);
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream(local_1a0);
  std::ios_base::~ios_base(local_120);
  return __return_storage_ptr__;
}

Assistant:

std::string MidiFile::getBase64(int width) {
	std::stringstream output;
	bool status = MidiFile::writeBase64(output, width);
	if (!status) {
		return "";
	} else {
		return output.str();
	}
}